

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcdiscover_reset.cc
# Opt level: O2

int runReset(string *command,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  undefined7 extraout_var;
  ostream *poVar5;
  size_t __n;
  void *__buf;
  int iVar6;
  char *pcVar7;
  undefined8 uVar8;
  int unaff_R12D;
  DeviceInfo *device;
  pointer pDVar9;
  undefined2 local_118;
  undefined1 local_116;
  undefined1 local_115;
  uint local_114;
  string *local_110;
  _Base_ptr local_108;
  vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_> devices;
  string p;
  string argv_0;
  DeviceFilter local_a8;
  
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.model.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.iface.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.mac.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.serial.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.name.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (argc == 0) {
    std::operator<<((ostream *)&std::cerr,"No operation specified\n");
    printHelp((ostream *)&std::cerr,command);
    unaff_R12D = 1;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&argv_0,*argv,(allocator<char> *)&p);
    bVar1 = std::operator==(&argv_0,"-h");
    if ((bVar1) || (bVar1 = std::operator==(&argv_0,"--help"), bVar1)) {
      unaff_R12D = 0;
      printHelp((ostream *)&std::cout,command);
    }
    else {
      cVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ResetCommand>_>_>
              ::find(&reset_commands_abi_cxx11_._M_t,&argv_0);
      if ((_Rb_tree_header *)cVar4._M_node !=
          &reset_commands_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
        iVar6 = 1;
        local_114 = 0;
        local_110 = command;
        local_108 = cVar4._M_node;
LAB_00113244:
        if (iVar6 < argc) goto code_r0x0011324c;
        if (((local_a8.mac.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_a8.mac.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish) &&
            (local_a8.name.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             local_a8.name.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)) &&
           (local_a8.serial.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            local_a8.serial.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          poVar5 = std::operator<<((ostream *)&std::cerr,"No filter set");
          std::endl<char,std::char_traits<char>>(poVar5);
          printHelp((ostream *)&std::cerr,local_110);
          goto LAB_001133b6;
        }
        discoverWithFilter(&devices,&local_a8);
        if (devices.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            devices.
            super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pcVar7 = "No device found";
          goto LAB_0011354e;
        }
        poVar5 = std::operator<<((ostream *)&std::cout,(string *)(local_108 + 3));
        std::operator<<(poVar5," of the following devices:\n");
        __n = 0;
        uVar8 = 0;
        printDeviceTable((ostream *)&std::cout,&devices,true,false,false);
        if ((local_114 & 1) == 0) {
          std::operator<<((ostream *)&std::cout,"Are you sure? [y/N] ");
          p._M_dataplus._M_p = (pointer)&p.field_2;
          p._M_string_length = 0;
          p.field_2._M_local_buf[0] = '\0';
          std::getline<char,std::char_traits<char>,std::allocator<char>>
                    ((istream *)&std::cin,(string *)&p);
          bVar2 = std::operator!=(&p,"y");
          bVar1 = true;
          if ((bVar2) && (bVar2 = std::operator!=(&p,"Y"), bVar2)) {
            poVar5 = std::operator<<((ostream *)&std::cout,"Cancel");
            bVar1 = false;
            std::endl<char,std::char_traits<char>>(poVar5);
            unaff_R12D = 0;
          }
          std::__cxx11::string::~string((string *)&p);
          if (!bVar1) goto LAB_00113568;
        }
        pcVar7 = "Done";
        for (pDVar9 = devices.
                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            pDVar9 != devices.
                      super__Vector_base<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>
                      ._M_impl.super__Vector_impl_data._M_finish; pDVar9 = pDVar9 + 1) {
          rcdiscover::WOL::WOL((WOL *)&p,pDVar9->mac,9);
          local_118 = 0xeeee;
          local_116 = 0xee;
          local_115 = (undefined1)local_108[4]._M_color;
          rcdiscover::WOL::send((WOL *)&p,(int)&local_118,__buf,__n,(int)uVar8);
        }
LAB_0011354e:
        poVar5 = std::operator<<((ostream *)&std::cout,pcVar7);
        unaff_R12D = 0;
        std::endl<char,std::char_traits<char>>(poVar5);
LAB_00113568:
        std::vector<rcdiscover::DeviceInfo,_std::allocator<rcdiscover::DeviceInfo>_>::~vector
                  (&devices);
        goto LAB_001131b8;
      }
      std::operator<<((ostream *)&std::cout,"Invalid operation specified\n");
      printHelp((ostream *)&std::cerr,command);
LAB_001133b6:
      unaff_R12D = 1;
    }
LAB_001131b8:
    std::__cxx11::string::~string((string *)&argv_0);
  }
  DeviceFilter::~DeviceFilter(&local_a8);
  return unaff_R12D;
code_r0x0011324c:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&p,argv[iVar6],(allocator<char> *)&devices);
  iVar6 = iVar6 + 1;
  bVar2 = std::operator==(&p,"-y");
  bVar1 = true;
  if (bVar2) {
    local_114 = (uint)CONCAT71(extraout_var,1);
  }
  else {
    bVar2 = std::operator==(&p,"-f");
    if (bVar2) {
      iVar3 = parseFilterArguments(argc - iVar6,argv + iVar6,&local_a8);
      iVar6 = iVar6 + iVar3;
    }
    else {
      bVar1 = std::operator==(&p,"-h");
      if ((bVar1) || (bVar1 = std::operator==(&p,"--help"), bVar1)) {
        bVar1 = false;
        printHelp((ostream *)&std::cout,local_110);
        unaff_R12D = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"Invalid argument: ");
        poVar5 = std::operator<<(poVar5,(string *)&p);
        std::operator<<(poVar5,'\n');
        printHelp((ostream *)&std::cerr,local_110);
        bVar1 = false;
        unaff_R12D = 1;
      }
    }
  }
  std::__cxx11::string::~string((string *)&p);
  if (!bVar1) goto LAB_001131b8;
  goto LAB_00113244;
}

Assistant:

int runReset(const std::string &command, int argc, char **argv)
{
  DeviceFilter device_filter{};
  bool yes = false;

  if (argc == 0)
  {
    std::cerr << "No operation specified\n";
    printHelp(std::cerr, command);
    return 1;
  }

  const std::string argv_0 = argv[0];
  if (argv_0 == "-h" || argv_0 == "--help")
  {
    printHelp(std::cout, command);
    return 0;
  }

  const auto reset_command = reset_commands.find(argv_0);
  if (reset_command == std::end(reset_commands))
  {
    std::cout << "Invalid operation specified\n";
    printHelp(std::cerr, command);
    return 1;
  }

  int i = 1;
  while (i < argc)
  {
    std::string p = argv[i++];

    if (p == "-y")
    {
      yes = true;
    }
    else if (p == "-f")
    {
      try
      {
        i += parseFilterArguments(argc - i, argv + i, device_filter);
      }
      catch (const std::invalid_argument &ex)
      {
        std::cerr << ex.what() << std::endl;
        printHelp(std::cerr, command);
        return 1;
      }
    }
    else if (p == "-h" || p == "--help")
    {
      printHelp(std::cout, command);
      return 0;
    }
    else
    {
      std::cerr << "Invalid argument: " << p << '\n';
      printHelp(std::cerr, command);
      return 1;
    }
  }

  if (device_filter.mac.empty() &&
      device_filter.name.empty() &&
      device_filter.serial.empty())
  {
    std::cerr << "No filter set" << std::endl;
    printHelp(std::cerr, command);
    return 1;
  }
  const auto devices = discoverWithFilter(device_filter);

  if (devices.empty())
  {
    std::cout << "No device found" << std::endl;
    return 0;
  }

  std::cout << reset_command->second.action << " of the following devices:\n";
  printDeviceTable(std::cout, devices, true, false, false);

  if (!yes)
  {
    std::cout << "Are you sure? [y/N] ";
    std::string answer;
    std::getline(std::cin, answer);
    if (answer != "y" && answer != "Y")
    {
      std::cout << "Cancel" << std::endl;
      return 0;
    }
  }

  for (const auto &device : devices)
  {
    rcdiscover::WOL wol(device.getMAC(), 9);
    wol.send({{0xEE, 0xEE, 0xEE, reset_command->second.id}});
  }

  std::cout << "Done" << std::endl;

  return 0;
}